

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::UdpPortDeclSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  local_9 = kind == UdpInputPortDecl || kind == UdpOutputPortDecl;
  return local_9;
}

Assistant:

bool UdpPortDeclSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::UdpInputPortDecl:
        case SyntaxKind::UdpOutputPortDecl:
            return true;
        default:
            return false;
    }
}